

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccessbackend_p.cpp
# Opt level: O2

void QNetworkAccessBackend::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  
  if (_c != RegisterMethodArgumentMetaType) {
    if (_c == InvokeMetaMethod) {
      switch(_id) {
      case 0:
        readyRead((QNetworkAccessBackend *)_o);
        return;
      case 1:
        finished((QNetworkAccessBackend *)_o);
        return;
      case 2:
        error((QNetworkAccessBackend *)_o,*_a[1],(QString *)_a[2]);
        return;
      case 3:
        proxyAuthenticationRequired((QNetworkAccessBackend *)_o,(QNetworkProxy *)_a[1],*_a[2]);
        return;
      case 4:
        authenticationRequired((QNetworkAccessBackend *)_o,*_a[1]);
        return;
      case 5:
        metaDataChanged((QNetworkAccessBackend *)_o);
        return;
      case 6:
        redirectionRequested((QNetworkAccessBackend *)_o,(QUrl *)_a[1]);
        return;
      }
    }
    return;
  }
  if (_id == 2) {
    puVar1 = (undefined8 *)*_a;
    if (*_a[1] == 0) {
      *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkReply::NetworkError>::metaType;
      return;
    }
  }
  else {
    puVar1 = (undefined8 *)*_a;
  }
  *puVar1 = 0;
  return;
}

Assistant:

void QNetworkAccessBackend::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QNetworkAccessBackend *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->readyRead(); break;
        case 1: _t->finished(); break;
        case 2: _t->error((*reinterpret_cast< std::add_pointer_t<QNetworkReply::NetworkError>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 3: _t->proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 4: _t->authenticationRequired((*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[1]))); break;
        case 5: _t->metaDataChanged(); break;
        case 6: _t->redirectionRequested((*reinterpret_cast< std::add_pointer_t<QUrl>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkReply::NetworkError >(); break;
            }
            break;
        }
    }
}